

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O1

void __thiscall libtorrent::aux::peer_list::set_failcount(peer_list *this,torrent_peer *p,int f)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  
  if (((p->connection == (peer_connection_interface *)0x0) &&
      (uVar1 = *(uint *)&p->field_0x1b, (uVar1 & 0x88000020) == 0x20)) &&
     ((-1 < (char)uVar1 || (-1 < *(int *)&this->field_0x60)))) {
    bVar2 = (int)(uVar1 & 0x1f) < this->m_max_failcount;
  }
  else {
    bVar2 = false;
  }
  uVar1 = *(uint *)&p->field_0x1b;
  *(uint *)&p->field_0x1b = uVar1 & 0xffffffe0 | f & 0x1fU;
  if (((uVar1 & 0x88000020) == 0x20 && p->connection == (peer_connection_interface *)0x0) &&
     ((-1 < (char)uVar1 || (-1 < *(int *)&this->field_0x60)))) {
    bVar3 = (int)(f & 0x1fU) < this->m_max_failcount;
  }
  else {
    bVar3 = false;
  }
  if (bVar2 != bVar3) {
    iVar4 = (-(uint)bVar2 | 1) + this->m_num_connect_candidates;
    iVar5 = 0;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    if (bVar2 == false) {
      iVar5 = iVar4;
    }
    this->m_num_connect_candidates = iVar5;
  }
  return;
}

Assistant:

bool peer_list::is_connect_candidate(torrent_peer const& p) const
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(p.in_use);
		if (p.connection
			|| p.banned
			|| p.web_seed
			|| !p.connectable
			|| (p.seed && m_finished)
			|| int(p.failcount) >= m_max_failcount)
			return false;

#if TORRENT_USE_RTC
		// unsolicited connections over RTC  is not possible
		if (p.is_rtc_addr) return false;
#endif

		return true;
	}